

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_stroke_curve(nk_command_buffer *b,float ax,float ay,float ctrl0x,float ctrl0y,float ctrl1x,
                    float ctrl1y,float bx,float by,float line_thickness,nk_color col)

{
  void *pvVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  if (b != (nk_command_buffer *)0x0) {
    if (0.0 < line_thickness && 0xffffff < (uint)col) {
      pvVar1 = nk_command_buffer_push(b,NK_COMMAND_CURVE,0x28);
      if (pvVar1 != (void *)0x0) {
        auVar2._0_4_ = (int)by;
        auVar2._4_4_ = (int)ctrl0x;
        auVar2._8_4_ = (int)ctrl0y;
        auVar2._12_4_ = (int)ctrl1x;
        auVar3._0_4_ = (int)line_thickness;
        auVar3._4_4_ = (int)ax;
        auVar3._8_4_ = (int)ay;
        auVar3._12_4_ = (int)bx;
        auVar4 = packssdw(auVar3,auVar2);
        auVar4 = auVar4 & _DAT_001570c0;
        auVar2 = ~_DAT_001570c0;
        *(short *)((long)pvVar1 + 0x20) = (short)(int)ctrl1y;
        *(undefined1 (*) [16])((long)pvVar1 + 0x10) = auVar2 & auVar3 | auVar4;
        *(short *)((long)pvVar1 + 0x22) = col._0_2_;
        *(nk_byte *)((long)pvVar1 + 0x24) = col.b;
        *(nk_byte *)((long)pvVar1 + 0x25) = col.a;
      }
    }
    return;
  }
  __assert_fail("b",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                ,0x2230,
                "void nk_stroke_curve(struct nk_command_buffer *, float, float, float, float, float, float, float, float, float, struct nk_color)"
               );
}

Assistant:

NK_API void
nk_stroke_curve(struct nk_command_buffer *b, float ax, float ay,
    float ctrl0x, float ctrl0y, float ctrl1x, float ctrl1y,
    float bx, float by, float line_thickness, struct nk_color col)
{
    struct nk_command_curve *cmd;
    NK_ASSERT(b);
    if (!b || col.a == 0 || line_thickness <= 0) return;

    cmd = (struct nk_command_curve*)
        nk_command_buffer_push(b, NK_COMMAND_CURVE, sizeof(*cmd));
    if (!cmd) return;
    cmd->line_thickness = (unsigned short)line_thickness;
    cmd->begin.x = (short)ax;
    cmd->begin.y = (short)ay;
    cmd->ctrl[0].x = (short)ctrl0x;
    cmd->ctrl[0].y = (short)ctrl0y;
    cmd->ctrl[1].x = (short)ctrl1x;
    cmd->ctrl[1].y = (short)ctrl1y;
    cmd->end.x = (short)bx;
    cmd->end.y = (short)by;
    cmd->color = col;
}